

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flatten.cpp
# Opt level: O2

void CoreMLConverter::convertCaffeFlatten(ConvertLayerParameters layerParameters)

{
  int iVar1;
  Rep *pRVar2;
  string *psVar3;
  Type *pTVar4;
  NeuralNetworkLayer *this;
  FlattenLayerParams *pFVar5;
  void **ppvVar6;
  FlattenParameter *pFVar7;
  long lVar8;
  long lVar9;
  allocator local_da;
  allocator local_d9;
  string local_d8;
  string local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  
  pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     (&((layerParameters.prototxt)->layer_).super_RepeatedPtrFieldBase,
                      *layerParameters.layerId);
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (layerParameters.nnWrite);
  if (((pTVar4->bottom_).super_RepeatedPtrFieldBase.current_size_ == 1) &&
     ((pTVar4->top_).super_RepeatedPtrFieldBase.current_size_ == 1)) {
    lVar9 = 1;
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_d8,"Must have 1 input and 1 output",(allocator *)&local_b8);
    errorInCaffeProto(&local_d8,(pTVar4->name_).ptr_,(pTVar4->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_d8);
    lVar9 = (long)(pTVar4->bottom_).super_RepeatedPtrFieldBase.current_size_;
  }
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar2 = (pTVar4->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar6 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar6 = (void **)0x0;
  }
  for (lVar8 = 0; lVar9 * 8 != lVar8; lVar8 = lVar8 + 8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&bottom,*(value_type **)((long)ppvVar6 + lVar8));
  }
  pRVar2 = (pTVar4->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar6 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar6 = (void **)0x0;
  }
  iVar1 = (pTVar4->top_).super_RepeatedPtrFieldBase.current_size_;
  for (lVar9 = 0; (long)iVar1 * 8 != lVar9; lVar9 = lVar9 + 8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&top,*(value_type **)((long)ppvVar6 + lVar9));
  }
  convertCaffeMetadata
            ((pTVar4->name_).ptr_,&bottom,&top,layerParameters.nnWrite,
             layerParameters.mappingDataBlobNames);
  pFVar7 = pTVar4->flatten_param_;
  if (pFVar7 == (FlattenParameter *)0x0) {
    pFVar7 = (FlattenParameter *)&caffe::_FlattenParameter_default_instance_;
  }
  if (pFVar7->axis_ != 1) {
    std::__cxx11::string::string((string *)&local_d8,"axis",&local_d9);
    psVar3 = (pTVar4->name_).ptr_;
    std::__cxx11::string::string((string *)&local_b8,"Flatten",&local_da);
    std::__cxx11::to_string(&local_68,pFVar7->axis_);
    unsupportedCaffeParrameterWithOption(&local_d8,psVar3,&local_b8,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  if ((pFVar7->end_axis_ != -1) && (pFVar7->end_axis_ != 3)) {
    std::__cxx11::string::string((string *)&local_d8,"end_axis",&local_d9);
    psVar3 = (pTVar4->name_).ptr_;
    std::__cxx11::string::string((string *)&local_b8,"Flatten",&local_da);
    std::__cxx11::to_string(&local_68,pFVar7->end_axis_);
    unsupportedCaffeParrameterWithOption(&local_d8,psVar3,&local_b8,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  pFVar5 = CoreML::Specification::NeuralNetworkLayer::mutable_flatten(this);
  pFVar5->mode_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&top);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&bottom);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeFlatten(CoreMLConverter::ConvertLayerParameters layerParameters){
    
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;

    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    const caffe::FlattenParameter& caffeLayerParams = caffeLayer.flatten_param();
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerParams.axis() != 1){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("axis",caffeLayer.name(), "Flatten",std::to_string(caffeLayerParams.axis()));
    }
    if (caffeLayerParams.end_axis() != -1) {
        if (caffeLayerParams.end_axis() != 3) {
            CoreMLConverter::unsupportedCaffeParrameterWithOption("end_axis", caffeLayer.name(), "Flatten",std::to_string(caffeLayerParams.end_axis()));
        }
    }
    //***************************************************************
    Specification::FlattenLayerParams* flatten_params = specLayer->mutable_flatten();
    flatten_params->set_mode(Specification::FlattenLayerParams::CHANNEL_FIRST);
}